

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogLikelihoodsFirstDeriv
          (BeagleCPUImpl<double,_1,_0> *this,int parIndex,int childIndex,int probIndex,
          int firstDerivativeIndex,int categoryWeightsIndex,int stateFrequenciesIndex,
          int scalingFactorsIndex,double *outSumLogLikelihood,double *outSumFirstDerivative)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int i_3;
  int k_3;
  double *scalingFactors;
  double *in_stack_00000018;
  int i_2;
  double sumOverID1;
  double sumOverI;
  int k_2;
  int u;
  int j;
  double sumOverJD1;
  double sumOverJ;
  int i_1;
  int w_1;
  int k_1;
  double weight_1;
  int u_2;
  int l_1;
  int v_1;
  double *partialsChild;
  int i;
  int w;
  int stateChild;
  int k;
  double weight;
  int u_1;
  int l;
  int v;
  int *statesChild;
  double *freqs;
  double *wt;
  double *firstDerivMatrix;
  double *transMatrix;
  double *partialsParent;
  int returnCode;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined4 local_dc;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined4 local_c4;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_6c;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_20;
  
  local_20 = 0;
  lVar3 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)in_ESI * 8);
  lVar4 = *(long *)(*(long *)(in_RDI + 0xd8) + (long)in_ECX * 8);
  lVar5 = *(long *)(*(long *)(in_RDI + 0xd8) + (long)in_R8D * 8);
  lVar6 = *(long *)(*(long *)(in_RDI + 0xa0) + (long)in_R9D * 8);
  lVar7 = *(long *)(*(long *)(in_RDI + 0xa8) + (long)i_3 * 8);
  memset(*(void **)(in_RDI + 0xe0),0,(long)(*(int *)(in_RDI + 0x14) * *(int *)(in_RDI + 0x24)) << 3)
  ;
  memset(*(void **)(in_RDI + 0xe8),0,(long)(*(int *)(in_RDI + 0x14) * *(int *)(in_RDI + 0x24)) << 3)
  ;
  if ((in_EDX < *(int *)(in_RDI + 0x10)) &&
     (*(long *)(*(long *)(in_RDI + 0xb8) + (long)in_EDX * 8) != 0)) {
    lVar8 = *(long *)(*(long *)(in_RDI + 0xb8) + (long)in_EDX * 8);
    local_54 = 0;
    for (local_58 = 0; local_58 < *(int *)(in_RDI + 0x34); local_58 = local_58 + 1) {
      local_5c = 0;
      uVar1 = *(ulong *)(lVar6 + (long)local_58 * 8);
      for (local_6c = 0; local_6c < *(int *)(in_RDI + 0x14); local_6c = local_6c + 1) {
        iVar2 = *(int *)(lVar8 + (long)local_6c * 4);
        local_74 = local_58 * *(int *)(in_RDI + 0x40);
        for (local_78 = 0; local_78 < *(int *)(in_RDI + 0x24); local_78 = local_78 + 1) {
          auVar10._8_8_ = 0;
          auVar10._0_8_ = uVar1;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_5c * 8);
          auVar20._8_8_ = 0;
          auVar20._0_8_ =
               *(double *)(lVar4 + (long)(local_74 + iVar2) * 8) *
               *(double *)(lVar3 + (long)(local_54 + local_78) * 8);
          auVar12 = vfmadd213sd_fma(auVar10,auVar20,auVar30);
          *(long *)(*(long *)(in_RDI + 0xe0) + (long)local_5c * 8) = auVar12._0_8_;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = uVar1;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe8) + (long)local_5c * 8);
          auVar21._8_8_ = 0;
          auVar21._0_8_ =
               *(double *)(lVar5 + (long)(local_74 + iVar2) * 8) *
               *(double *)(lVar3 + (long)(local_54 + local_78) * 8);
          auVar12 = vfmadd213sd_fma(auVar11,auVar21,auVar31);
          *(long *)(*(long *)(in_RDI + 0xe8) + (long)local_5c * 8) = auVar12._0_8_;
          local_5c = local_5c + 1;
          local_74 = *(int *)(in_RDI + 0x28) + local_74;
        }
        local_54 = *(int *)(in_RDI + 0x2c) + local_54;
      }
    }
  }
  else {
    lVar8 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)in_EDX * 8);
    local_84 = 0;
    for (local_88 = 0; local_88 < *(int *)(in_RDI + 0x34); local_88 = local_88 + 1) {
      local_8c = 0;
      uVar1 = *(ulong *)(lVar6 + (long)local_88 * 8);
      for (local_9c = 0; local_9c < *(int *)(in_RDI + 0x14); local_9c = local_9c + 1) {
        local_a0 = local_88 * *(int *)(in_RDI + 0x40);
        for (local_a4 = 0; local_a4 < *(int *)(in_RDI + 0x24); local_a4 = local_a4 + 1) {
          local_b0 = 0.0;
          local_b8 = 0.0;
          for (local_bc = 0; local_bc < *(int *)(in_RDI + 0x24); local_bc = local_bc + 1) {
            auVar22._8_8_ = 0;
            auVar22._0_8_ = *(ulong *)(lVar4 + (long)local_a0 * 8);
            auVar12._8_8_ = 0;
            auVar12._0_8_ = *(ulong *)(lVar8 + (long)(local_84 + local_bc) * 8);
            auVar32._8_8_ = 0;
            auVar32._0_8_ = local_b0;
            auVar12 = vfmadd213sd_fma(auVar12,auVar22,auVar32);
            local_b0 = auVar12._0_8_;
            auVar23._8_8_ = 0;
            auVar23._0_8_ = *(ulong *)(lVar5 + (long)local_a0 * 8);
            auVar13._8_8_ = 0;
            auVar13._0_8_ = *(ulong *)(lVar8 + (long)(local_84 + local_bc) * 8);
            auVar33._8_8_ = 0;
            auVar33._0_8_ = local_b8;
            auVar12 = vfmadd213sd_fma(auVar13,auVar23,auVar33);
            local_b8 = auVar12._0_8_;
            local_a0 = local_a0 + 1;
          }
          local_a0 = local_a0 + 1;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = uVar1;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_8c * 8);
          auVar24._8_8_ = 0;
          auVar24._0_8_ = local_b0 * *(double *)(lVar3 + (long)(local_84 + local_a4) * 8);
          auVar12 = vfmadd213sd_fma(auVar14,auVar24,auVar34);
          *(long *)(*(long *)(in_RDI + 0xe0) + (long)local_8c * 8) = auVar12._0_8_;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = uVar1;
          auVar35._8_8_ = 0;
          auVar35._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe8) + (long)local_8c * 8);
          auVar25._8_8_ = 0;
          auVar25._0_8_ = local_b8 * *(double *)(lVar3 + (long)(local_84 + local_a4) * 8);
          auVar12 = vfmadd213sd_fma(auVar15,auVar25,auVar35);
          *(long *)(*(long *)(in_RDI + 0xe8) + (long)local_8c * 8) = auVar12._0_8_;
          local_8c = local_8c + 1;
        }
        local_84 = *(int *)(in_RDI + 0x2c) + local_84;
      }
    }
  }
  local_c0 = 0;
  for (local_c4 = 0; local_c4 < *(int *)(in_RDI + 0x14); local_c4 = local_c4 + 1) {
    local_d0 = 0.0;
    local_d8 = 0.0;
    for (local_dc = 0; local_dc < *(int *)(in_RDI + 0x24); local_dc = local_dc + 1) {
      auVar26._8_8_ = 0;
      auVar26._0_8_ = *(ulong *)(lVar7 + (long)local_dc * 8);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_c0 * 8);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_d0;
      auVar12 = vfmadd213sd_fma(auVar16,auVar26,auVar36);
      local_d0 = auVar12._0_8_;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(ulong *)(lVar7 + (long)local_dc * 8);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe8) + (long)local_c0 * 8);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = local_d8;
      auVar12 = vfmadd213sd_fma(auVar17,auVar27,auVar37);
      local_d8 = auVar12._0_8_;
      local_c0 = local_c0 + 1;
    }
    dVar9 = log(local_d0);
    *(double *)(*(long *)(in_RDI + 0x110) + (long)local_c4 * 8) = dVar9;
    *(double *)(*(long *)(in_RDI + 0x118) + (long)local_c4 * 8) = local_d8 / local_d0;
  }
  if ((int)scalingFactors != -1) {
    lVar3 = *(long *)(*(long *)(in_RDI + 0xc0) + (long)(int)scalingFactors * 8);
    for (local_ec = 0; local_ec < *(int *)(in_RDI + 0x14); local_ec = local_ec + 1) {
      *(double *)(*(long *)(in_RDI + 0x110) + (long)local_ec * 8) =
           *(double *)(lVar3 + (long)local_ec * 8) +
           *(double *)(*(long *)(in_RDI + 0x110) + (long)local_ec * 8);
    }
  }
  *in_stack_00000018 = 0.0;
  *(undefined8 *)sumOverID1 = 0;
  for (local_f0 = 0; local_f0 < *(int *)(in_RDI + 0x14); local_f0 = local_f0 + 1) {
    auVar28._8_8_ = 0;
    auVar28._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x110) + (long)local_f0 * 8);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x80) + (long)local_f0 * 8);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = *in_stack_00000018;
    auVar12 = vfmadd213sd_fma(auVar18,auVar28,auVar38);
    *in_stack_00000018 = auVar12._0_8_;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x118) + (long)local_f0 * 8);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x80) + (long)local_f0 * 8);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = *(ulong *)sumOverID1;
    auVar12 = vfmadd213sd_fma(auVar19,auVar29,auVar39);
    *(long *)sumOverID1 = auVar12._0_8_;
  }
  if ((*in_stack_00000018 != *in_stack_00000018) ||
     (NAN(*in_stack_00000018) || NAN(*in_stack_00000018))) {
    local_20 = -8;
  }
  return local_20;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsFirstDeriv(const int parIndex,
                                                               const int childIndex,
                                                               const int probIndex,
                                                               const int firstDerivativeIndex,
                                                               const int categoryWeightsIndex,
                                                               const int stateFrequenciesIndex,
                                                               const int scalingFactorsIndex,
                                                               double* outSumLogLikelihood,
                                                               double* outSumFirstDerivative) {

    assert(parIndex >= kTipCount);

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];


    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));
    memset(firstDerivTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                // so we can interchange the patterCount and categoryCount loop order?
                int w =  l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += firstDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    u++;

                    w += kTransPaddedStateCount;
                }
                v += kPartialsPaddedStateCount;
            }
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
        int v = 0;

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {
                int w = l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    double sumOverJ = 0.0;
                    double sumOverJD1 = 0.0;
                    for(int j = 0; j < kStateCount; j++) {
                        sumOverJ += transMatrix[w] * partialsChild[v + j];
                        sumOverJD1 += firstDerivMatrix[w] * partialsChild[v + j];
                        w++;
                    }

                    // increment for the extra column at the end
                    w += T_PAD;

                    integrationTmp[u] += sumOverJ * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += sumOverJD1 * partialsParent[v + i] * weight;
                    u++;
                }
                v += kPartialsPaddedStateCount;
            }
        }
    }

    int u = 0;
    for(int k = 0; k < kPatternCount; k++) {
        REALTYPE sumOverI = 0.0;
        REALTYPE sumOverID1 = 0.0;
        for(int i = 0; i < kStateCount; i++) {
            sumOverI += freqs[i] * integrationTmp[u];
            sumOverID1 += freqs[i] * firstDerivTmp[u];
            u++;
        }

        outLogLikelihoodsTmp[k] = log(sumOverI);
        outFirstDerivativesTmp[k] = sumOverID1 / sumOverI;
    }


    if (scalingFactorsIndex != BEAGLE_OP_NONE) {
        const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
        for(int k=0; k < kPatternCount; k++)
            outLogLikelihoodsTmp[k] += scalingFactors[k];
    }

    *outSumLogLikelihood = 0.0;
    *outSumFirstDerivative = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];

        *outSumFirstDerivative += outFirstDerivativesTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}